

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlRule.h
# Opt level: O0

undefined8 __thiscall GdlRuleItem::PosString_abi_cxx11_(GdlRuleItem *this)

{
  undefined8 in_RDI;
  int in_stack_0000003c;
  
  std::__cxx11::to_string(in_stack_0000003c);
  return in_RDI;
}

Assistant:

std::string PosString()
	{
		return std::to_string(m_iritContextPosOrig + 1);
	}